

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

void __thiscall QFSFileEngine::~QFSFileEngine(QFSFileEngine *this)

{
  QFSFileEnginePrivate *pQVar1;
  undefined8 *in_RDI;
  QFSFileEnginePrivate *unaff_retaddr;
  QFSFileEnginePrivate *d;
  
  *in_RDI = &PTR__QFSFileEngine_001f34e0;
  pQVar1 = d_func((QFSFileEngine *)0x134619);
  if ((pQVar1->closeFileHandle & 1U) != 0) {
    if (pQVar1->fh == (FILE *)0x0) {
      if (pQVar1->fd != -1) {
        qt_safe_close((int)((ulong)pQVar1 >> 0x20));
      }
    }
    else {
      fclose((FILE *)pQVar1->fh);
    }
  }
  QFSFileEnginePrivate::unmapAll(unaff_retaddr);
  QAbstractFileEngine::~QAbstractFileEngine((QAbstractFileEngine *)0x134683);
  return;
}

Assistant:

QFSFileEngine::~QFSFileEngine()
{
    Q_D(QFSFileEngine);
    if (d->closeFileHandle) {
        if (d->fh) {
            fclose(d->fh);
        } else if (d->fd != -1) {
            QT_CLOSE(d->fd);
        }
    }
    d->unmapAll();
}